

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::FileEntry::tostream(FileEntry *this,XipFile *xip,ReadWriter_ptr *w)

{
  element_type *this_00;
  shared_ptr<ReadWriter> local_40;
  undefined1 local_30 [8];
  ReadWriter_ptr r;
  ReadWriter_ptr *w_local;
  XipFile *xip_local;
  FileEntry *this_local;
  
  r.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)w;
  (*(this->super_XipEntry)._vptr_XipEntry[6])
            ((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30,
             this,xip);
  this_00 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_30);
  std::shared_ptr<ReadWriter>::shared_ptr(&local_40,w);
  ReadWriter::copyto<std::shared_ptr<ReadWriter>>(this_00,&local_40);
  std::shared_ptr<ReadWriter>::~shared_ptr(&local_40);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_30);
  return;
}

Assistant:

virtual void tostream(XipFile& xip, ReadWriter_ptr w)
        {
            ReadWriter_ptr r= getdatareader(xip);

            r->copyto(w);
        }